

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O0

bool __thiscall irr::CIrrDeviceStub::postEventFromUser(CIrrDeviceStub *this,SEvent *event)

{
  byte bVar1;
  undefined8 in_RSI;
  long in_RDI;
  ISceneManager *inputReceiver;
  bool absorbed;
  undefined8 local_20;
  undefined1 local_11;
  
  local_11 = false;
  if (*(long *)(in_RDI + 0x30) != 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))(*(long **)(in_RDI + 0x30),in_RSI);
    local_11 = (bool)(bVar1 & 1);
  }
  if ((local_11 == false) && (*(long *)(in_RDI + 0x10) != 0)) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x50))(*(long **)(in_RDI + 0x10),in_RSI);
    local_11 = (bool)(bVar1 & 1);
  }
  local_20 = *(long **)(in_RDI + 0x50);
  if (local_20 == (long *)0x0) {
    local_20 = *(long **)(in_RDI + 0x18);
  }
  if ((local_11 == false) && (local_20 != (long *)0x0)) {
    bVar1 = (**(code **)(*local_20 + 200))(local_20,in_RSI);
    local_11 = (bool)(bVar1 & 1);
  }
  return local_11;
}

Assistant:

bool CIrrDeviceStub::postEventFromUser(const SEvent &event)
{
	bool absorbed = false;

	if (UserReceiver)
		absorbed = UserReceiver->OnEvent(event);

	if (!absorbed && GUIEnvironment)
		absorbed = GUIEnvironment->postEventFromUser(event);

	scene::ISceneManager *inputReceiver = InputReceivingSceneManager;
	if (!inputReceiver)
		inputReceiver = SceneManager;

	if (!absorbed && inputReceiver)
		absorbed = inputReceiver->postEventFromUser(event);

	return absorbed;
}